

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_element_suite.cpp
# Opt level: O0

void max_array_arithmetic(void)

{
  bool v;
  type v_00;
  reference lhs;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_160;
  double local_158;
  iterator local_150;
  iterator local_138;
  iterator local_120;
  undefined1 local_108 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_d8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_a8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_78,3.0);
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_160 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_160 = local_160 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_160);
  } while (local_160 != &local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::max_element<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_108,&local_120,&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_150,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  v = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                ((iterator *)local_108,&local_150);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/max_element_suite.cpp"
             ,0x58,"void max_array_arithmetic()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                  ((iterator *)local_108);
  local_158 = 3.0;
  v_00 = trial::dynamic::operator==(lhs,&local_158);
  boost::detail::test_impl
            ("*where == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/max_element_suite.cpp"
             ,0x59,"void max_array_arithmetic()",v_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void max_array_arithmetic()
{
    variable data = array::make({false, 2, 3.0});
    auto where = std::max_element(data.begin(), data.end());
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(*where == 3.0);
}